

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O3

KNearestNeighborsClassifier *
buildBasicNearestNeighborClassifier
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,char *outTensorName)

{
  int iVar1;
  ModelDescription *pMVar2;
  Type *pTVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *this;
  StringFeatureType *this_00;
  KNearestNeighborsClassifier *this_01;
  Int64Parameter *pIVar5;
  Int64Set *this_02;
  NearestNeighborsIndex *this_03;
  SingleKdTreeIndex *this_04;
  SquaredEuclideanDistance *this_05;
  Type *pTVar6;
  UniformWeighting *this_06;
  StringVector *this_07;
  long lVar7;
  int iVar8;
  int iVar9;
  Type local_50;
  
  pMVar2 = m->description_;
  if (pMVar2 == (ModelDescription *)0x0) {
    pMVar2 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar2);
    m->description_ = pMVar2;
  }
  pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(pMVar2->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  CoreML::Specification::FeatureDescription::set_name(pTVar3,inTensorAttr->name);
  pFVar4 = pTVar3->type_;
  if (pFVar4 == (FeatureType *)0x0) {
    pFVar4 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar4);
    pTVar3->type_ = pFVar4;
  }
  if (pFVar4->_oneof_case_[0] == 5) {
    this = (pFVar4->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar4);
    pFVar4->_oneof_case_[0] = 5;
    this = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(this);
    (pFVar4->Type_).multiarraytype_ = this;
  }
  this->datatype_ = 0x10020;
  iVar1 = inTensorAttr->dimension;
  if (0 < iVar1) {
    iVar9 = (this->shape_).current_size_;
    iVar8 = 0;
    do {
      if (iVar9 == (this->shape_).total_size_) {
        google::protobuf::RepeatedField<long>::Reserve(&this->shape_,iVar9 + 1);
        iVar9 = (this->shape_).current_size_;
        iVar1 = inTensorAttr->dimension;
      }
      lVar7 = (long)iVar9;
      iVar9 = iVar9 + 1;
      (this->shape_).current_size_ = iVar9;
      ((this->shape_).rep_)->elements[lVar7] = 1;
      iVar8 = iVar8 + 1;
    } while (iVar8 < iVar1);
  }
  pMVar2 = m->description_;
  if (pMVar2 == (ModelDescription *)0x0) {
    pMVar2 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar2);
    m->description_ = pMVar2;
  }
  pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(pMVar2->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  CoreML::Specification::FeatureDescription::set_name(pTVar3,outTensorName);
  pFVar4 = pTVar3->type_;
  if (pFVar4 == (FeatureType *)0x0) {
    pFVar4 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar4);
    pTVar3->type_ = pFVar4;
  }
  if (pFVar4->_oneof_case_[0] != 3) {
    CoreML::Specification::FeatureType::clear_Type(pFVar4);
    pFVar4->_oneof_case_[0] = 3;
    this_00 = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::StringFeatureType::StringFeatureType(this_00);
    (pFVar4->Type_).stringtype_ = this_00;
  }
  pMVar2 = m->description_;
  if (pMVar2 == (ModelDescription *)0x0) {
    pMVar2 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar2);
    m->description_ = pMVar2;
  }
  CoreML::Specification::ModelDescription::set_predictedfeaturename(pMVar2,outTensorName);
  m->specificationversion_ = 4;
  if (m->_oneof_case_[0] == 0x194) {
    this_01 = (m->Type_).knearestneighborsclassifier_;
  }
  else {
    CoreML::Specification::Model::clear_Type(m);
    m->_oneof_case_[0] = 0x194;
    this_01 = (KNearestNeighborsClassifier *)operator_new(0x48);
    CoreML::Specification::KNearestNeighborsClassifier::KNearestNeighborsClassifier(this_01);
    (m->Type_).knearestneighborsclassifier_ = this_01;
  }
  pIVar5 = this_01->numberofneighbors_;
  if (pIVar5 == (Int64Parameter *)0x0) {
    pIVar5 = (Int64Parameter *)operator_new(0x28);
    CoreML::Specification::Int64Parameter::Int64Parameter(pIVar5);
    this_01->numberofneighbors_ = pIVar5;
  }
  if (pIVar5->_oneof_case_[0] == 0xb) {
    this_02 = (pIVar5->AllowedValues_).set_;
  }
  else {
    CoreML::Specification::Int64Parameter::clear_AllowedValues(pIVar5);
    pIVar5->_oneof_case_[0] = 0xb;
    this_02 = (Int64Set *)operator_new(0x28);
    CoreML::Specification::Int64Set::Int64Set(this_02);
    (pIVar5->AllowedValues_).set_ = this_02;
  }
  iVar1 = (this_02->values_).current_size_;
  if (iVar1 == (this_02->values_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&this_02->values_,iVar1 + 1);
    iVar1 = (this_02->values_).current_size_;
  }
  (this_02->values_).current_size_ = iVar1 + 1;
  ((this_02->values_).rep_)->elements[iVar1] = 3;
  pIVar5 = this_01->numberofneighbors_;
  if (pIVar5 == (Int64Parameter *)0x0) {
    pIVar5 = (Int64Parameter *)operator_new(0x28);
    CoreML::Specification::Int64Parameter::Int64Parameter(pIVar5);
    this_01->numberofneighbors_ = pIVar5;
  }
  pIVar5->defaultvalue_ = 3;
  this_03 = this_01->nearestneighborsindex_;
  if (this_03 == (NearestNeighborsIndex *)0x0) {
    this_03 = (NearestNeighborsIndex *)operator_new(0x50);
    CoreML::Specification::NearestNeighborsIndex::NearestNeighborsIndex(this_03);
    this_01->nearestneighborsindex_ = this_03;
  }
  if (this_03->_oneof_case_[0] == 0x6e) {
    this_04 = (SingleKdTreeIndex *)(this_03->IndexType_).linearindex_;
  }
  else {
    CoreML::Specification::NearestNeighborsIndex::clear_IndexType(this_03);
    this_03->_oneof_case_[0] = 0x6e;
    this_04 = (SingleKdTreeIndex *)operator_new(0x18);
    CoreML::Specification::SingleKdTreeIndex::SingleKdTreeIndex(this_04);
    (this_03->IndexType_).singlekdtreeindex_ = this_04;
  }
  this_04->leafsize_ = 0x1e;
  if (this_03->_oneof_case_[1] != 200) {
    CoreML::Specification::NearestNeighborsIndex::clear_DistanceFunction(this_03);
    this_03->_oneof_case_[1] = 200;
    this_05 = (SquaredEuclideanDistance *)operator_new(0x18);
    CoreML::Specification::SquaredEuclideanDistance::SquaredEuclideanDistance(this_05);
    (this_03->DistanceFunction_).squaredeuclideandistance_ = this_05;
  }
  this_03->numberofdimensions_ = inTensorAttr->dimension;
  iVar9 = 0;
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                     (&(this_03->floatsamples_).super_RepeatedPtrFieldBase,(Type *)0x0);
  iVar1 = inTensorAttr->dimension;
  if (0 < iVar1) {
    iVar8 = (pTVar6->vector_).current_size_;
    do {
      if (iVar8 == (pTVar6->vector_).total_size_) {
        google::protobuf::RepeatedField<float>::Reserve(&pTVar6->vector_,iVar8 + 1);
        iVar8 = (pTVar6->vector_).current_size_;
        iVar1 = inTensorAttr->dimension;
      }
      lVar7 = (long)iVar8;
      iVar8 = iVar8 + 1;
      (pTVar6->vector_).current_size_ = iVar8;
      ((pTVar6->vector_).rep_)->elements[lVar7] = (float)iVar9;
      iVar9 = iVar9 + 1;
    } while (iVar9 < iVar1);
  }
  if (this_01->_oneof_case_[2] != 200) {
    CoreML::Specification::KNearestNeighborsClassifier::clear_WeightingScheme(this_01);
    this_01->_oneof_case_[2] = 200;
    this_06 = (UniformWeighting *)operator_new(0x18);
    CoreML::Specification::UniformWeighting::UniformWeighting(this_06);
    (this_01->WeightingScheme_).uniformweighting_ = this_06;
  }
  if (this_01->_oneof_case_[0] == 100) {
    this_07 = (this_01->ClassLabels_).stringclasslabels_;
  }
  else {
    CoreML::Specification::KNearestNeighborsClassifier::clear_ClassLabels(this_01);
    this_01->_oneof_case_[0] = 100;
    this_07 = (StringVector *)operator_new(0x30);
    CoreML::Specification::StringVector::StringVector(this_07);
    (this_01->ClassLabels_).stringclasslabels_ = this_07;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"zero","");
  google::protobuf::internal::RepeatedPtrFieldBase::
  Add<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this_07->vector_).super_RepeatedPtrFieldBase,&local_50,(enable_if<true,_void> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (isUpdatable) {
    m->isupdatable_ = true;
  }
  return this_01;
}

Assistant:

Specification::KNearestNeighborsClassifier* buildBasicNearestNeighborClassifier(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, const char *outTensorName) {
    auto inTensor = m.mutable_description()->add_input();
    inTensor->set_name(inTensorAttr->name);
    auto inTensorShape = inTensor->mutable_type()->mutable_multiarraytype();
    inTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < inTensorAttr->dimension; i++) {
        inTensorShape->add_shape(1);
    }
    
    auto outTensor = m.mutable_description()->add_output();
    outTensor->set_name(outTensorName);
    outTensor->mutable_type()->mutable_stringtype();
    
    m.mutable_description()->set_predictedfeaturename(outTensorName);
    
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    
    auto nearestNeighborClassifier = m.mutable_knearestneighborsclassifier();
    int numberOfNeighbors = 3;
    nearestNeighborClassifier->mutable_numberofneighbors()->mutable_set()->add_values(numberOfNeighbors);
    nearestNeighborClassifier->mutable_numberofneighbors()->set_defaultvalue(numberOfNeighbors);

    auto nearestNeighborIndex = nearestNeighborClassifier->mutable_nearestneighborsindex();
    
    nearestNeighborIndex->mutable_singlekdtreeindex()->set_leafsize(30);
    nearestNeighborIndex->mutable_squaredeuclideandistance();
    
    nearestNeighborIndex->set_numberofdimensions(inTensorAttr->dimension);
    
    auto floatVector = nearestNeighborIndex->add_floatsamples();
    auto pointVector = floatVector->mutable_vector();
    for (int i = 0; i < inTensorAttr->dimension; i++) {
        pointVector->Add((float)i);
    }
    
    nearestNeighborClassifier->mutable_uniformweighting();
    nearestNeighborClassifier->mutable_stringclasslabels()->add_vector(std::string("zero"));
    
    if (isUpdatable) {
        m.set_isupdatable(true);
    }
    
    return nearestNeighborClassifier;
}